

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_BonusTiles_Multiple_Test::~TEST_WiningStateTest_BonusTiles_Multiple_Test
          (TEST_WiningStateTest_BonusTiles_Multiple_Test *this)

{
  TEST_GROUP_CppUTestGroupWiningStateTest::~TEST_GROUP_CppUTestGroupWiningStateTest
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(WiningStateTest, BonusTiles_Multiple)
{
	addPair(Tile::OneOfBamboos);
	addSequence(Tile::TwoOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::OneOfBamboos);	
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);	
	
	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(8, r.bonus_tile_count);
	CHECK_EQUAL(9, r.doubling_factor);
}